

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O0

int kvtree_util_get_ptr(kvtree *hash,char *key,void **val)

{
  int iVar1;
  void *pvStack_38;
  int sscanf_rc;
  void *val_tmp;
  char *val_str;
  void **ppvStack_20;
  int rc;
  void **val_local;
  char *key_local;
  kvtree *hash_local;
  
  val_str._4_4_ = 1;
  ppvStack_20 = val;
  val_local = (void **)key;
  key_local = (char *)hash;
  val_tmp = kvtree_get_val(hash,key);
  if (((char *)val_tmp != (char *)0x0) &&
     (iVar1 = __isoc99_sscanf(val_tmp,"%p",&stack0xffffffffffffffc8), iVar1 == 1)) {
    *ppvStack_20 = pvStack_38;
    val_str._4_4_ = 0;
  }
  return val_str._4_4_;
}

Assistant:

int kvtree_util_get_ptr(const kvtree* hash, const char* key, void** val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    void* val_tmp;
    int sscanf_rc = sscanf(val_str, "%p", &val_tmp);
    if (sscanf_rc == 1) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}